

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sDrawTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Stress::anon_unknown_0::DrawInvalidRangeCase::DrawInvalidRangeCase
          (DrawInvalidRangeCase *this,Context *ctx,char *name,char *desc,deUint32 min,deUint32 max,
          bool useLimitMin,bool useLimitMax)

{
  bool useLimitMax_local;
  bool useLimitMin_local;
  deUint32 max_local;
  deUint32 min_local;
  char *desc_local;
  char *name_local;
  Context *ctx_local;
  DrawInvalidRangeCase *this_local;
  
  gles3::TestCase::TestCase(&this->super_TestCase,ctx,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DrawInvalidRangeCase_032aa7f0;
  this->m_min = min;
  this->m_max = max;
  this->m_bufferedElements = 0x80;
  this->m_numIndices = 0x40;
  this->m_useLimitMin = useLimitMin;
  this->m_useLimitMax = useLimitMax;
  this->m_buffer = 0;
  this->m_indexBuffer = 0;
  this->m_program = (ShaderProgram *)0x0;
  return;
}

Assistant:

DrawInvalidRangeCase::DrawInvalidRangeCase (Context& ctx, const char* name, const char* desc, deUint32 min, deUint32 max, bool useLimitMin, bool useLimitMax)
	: TestCase				(ctx, name, desc)
	, m_min					(min)
	, m_max					(max)
	, m_bufferedElements	(128)
	, m_numIndices			(64)
	, m_useLimitMin			(useLimitMin)
	, m_useLimitMax			(useLimitMax)
	, m_buffer				(0)
	, m_indexBuffer			(0)
	, m_program				(DE_NULL)
{
}